

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O2

msocket_t * msocket_accept(msocket_t *self,msocket_t *child)

{
  pthread_mutex_t *__mutex;
  uint8_t uVar1;
  int iVar2;
  msocket_t *self_00;
  char *pcVar3;
  in_addr *__cp;
  int iVar4;
  socklen_t local_5c;
  sockaddr_in cli_addr;
  
  if (self == (msocket_t *)0x0) {
    return (msocket_t *)0x0;
  }
  if (self->state != '\x01') {
    return (msocket_t *)0x0;
  }
  if (child == (msocket_t *)0x0) {
    self_00 = msocket_new(self->addressFamily);
  }
  else {
    msocket_create(child,self->addressFamily);
    self_00 = child;
  }
  __mutex = &self->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  self->state = '\x02';
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  uVar1 = self->addressFamily;
  iVar4 = -1;
  if (uVar1 == '\x01') {
    iVar2 = accept(self->tcpsockfd,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar2 < 0) goto LAB_0013cb7c;
    self_00->tcpsockfd = iVar2;
  }
  else {
    if (uVar1 == '\n') {
      local_5c = 0x1c;
      cli_addr.sin_family = 0;
      cli_addr.sin_port = 0;
      cli_addr.sin_addr.s_addr = 0;
      cli_addr.sin_zero[0] = '\0';
      cli_addr.sin_zero[1] = '\0';
      cli_addr.sin_zero[2] = '\0';
      cli_addr.sin_zero[3] = '\0';
      cli_addr.sin_zero[4] = '\0';
      cli_addr.sin_zero[5] = '\0';
      cli_addr.sin_zero[6] = '\0';
      cli_addr.sin_zero[7] = '\0';
      iVar2 = accept(self->tcpsockfd,(sockaddr *)&cli_addr,&local_5c);
      iVar4 = -1;
      if (iVar2 < 0) goto LAB_0013cb7c;
      __cp = (in_addr *)cli_addr.sin_zero;
    }
    else {
      if (uVar1 != '\x02') goto LAB_0013cb7c;
      local_5c = 0x10;
      cli_addr.sin_family = 0;
      cli_addr.sin_port = 0;
      cli_addr.sin_addr.s_addr = 0;
      cli_addr.sin_zero[0] = '\0';
      cli_addr.sin_zero[1] = '\0';
      cli_addr.sin_zero[2] = '\0';
      cli_addr.sin_zero[3] = '\0';
      cli_addr.sin_zero[4] = '\0';
      cli_addr.sin_zero[5] = '\0';
      cli_addr.sin_zero[6] = '\0';
      cli_addr.sin_zero[7] = '\0';
      iVar2 = accept(self->tcpsockfd,(sockaddr *)&cli_addr,&local_5c);
      iVar4 = -1;
      if (iVar2 < 0) goto LAB_0013cb7c;
      __cp = &cli_addr.sin_addr;
    }
    iVar4 = -1;
    pcVar3 = inet_ntop(2,__cp,(self_00->tcpInfo).addr,0x2e);
    if (pcVar3 == (char *)0x0) {
      close(iVar2);
      goto LAB_0013cb7c;
    }
    (self_00->tcpInfo).port = cli_addr.sin_port << 8 | cli_addr.sin_port >> 8;
    self_00->tcpsockfd = iVar2;
  }
  iVar4 = 0;
LAB_0013cb7c:
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  self->state = '\x01';
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (iVar4 < 0) {
    if (child == (msocket_t *)0x0) {
      msocket_delete(self_00);
    }
    else {
      msocket_destroy(self_00);
    }
    return (msocket_t *)0x0;
  }
  if ((self_00->addressFamily | 8) == 10) {
    cli_addr.sin_family = 1;
    cli_addr.sin_port = 0;
    setsockopt(self_00->tcpsockfd,6,1,&cli_addr,4);
  }
  pthread_mutex_lock((pthread_mutex_t *)&self_00->mutex);
  self_00->state = '\x04';
  self_00->socketMode = '\x02';
  self_00->newConnection = '\x01';
  pthread_mutex_unlock((pthread_mutex_t *)&self_00->mutex);
  return self_00;
}

Assistant:

msocket_t *msocket_accept(msocket_t *self, msocket_t *child){
   if ( (self != 0) && (self->state == MSOCKET_STATE_LISTENING) ) {

      uint8_t placementNew = 0u;
      int result = 0u;

      if(child == 0) {
         child = msocket_new(self->addressFamily);
      }
      else {
         placementNew = 1;
         msocket_create(child,self->addressFamily);
      }
      MUTEX_LOCK(self->mutex);
      self->state = MSOCKET_STATE_ACCEPTING;
      MUTEX_UNLOCK(self->mutex);

      switch (self->addressFamily) {
      case AF_INET:
         result = msocket_accept_inet(self, child);
         break;
      case AF_INET6:
         result = msocket_accept_inet6(self, child);
         break;
#ifndef _WIN32
      case AF_LOCAL:
         result = msocket_accept_local(self, child);
         break;
      default:
         result = -1;
#endif
      }

      MUTEX_LOCK(self->mutex);
      self->state = MSOCKET_STATE_LISTENING;
      MUTEX_UNLOCK(self->mutex);

      if (result < 0) {
         if (placementNew == 0) {
            msocket_delete(child);
         }
         else {
            msocket_destroy(child);
         }
         return (msocket_t*)0;
      }

      if ( (child->addressFamily == AF_INET) || (child->addressFamily == AF_INET6) ) {
         int sockoptval = 1;
         socklen_t sockoptlen = sizeof(sockoptval);
         setsockopt(child->tcpsockfd, IPPROTO_TCP, TCP_NODELAY, (const char*)&sockoptval, sockoptlen);
      }

      MUTEX_LOCK(child->mutex);
      child->state = MSOCKET_STATE_ESTABLISHED;
      child->socketMode = MSOCKET_MODE_TCP;
      child->newConnection = 1;
      MUTEX_UNLOCK(child->mutex);
      return child;
   }
   return (msocket_t *) 0;
}